

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_SecureChannelManager_open
          (UA_SecureChannelManager *cm,UA_Connection *conn,UA_OpenSecureChannelRequest *request,
          UA_OpenSecureChannelResponse *response)

{
  UA_ByteString *nonce;
  UA_UInt32 UVar1;
  uint uVar2;
  channel_list_entry *pcVar3;
  undefined4 uVar4;
  uint uVar5;
  UA_StatusCode UVar6;
  channel_list_entry *pcVar7;
  UA_DateTime UVar8;
  UA_SecureChannelManager *pUVar9;
  UA_String UVar10;
  
  UVar6 = 0x80540000;
  if (request->securityMode == UA_MESSAGESECURITYMODE_NONE) {
    pUVar9 = cm;
    if (cm->currentChannelCount < (uint)(cm->server->config).maxSecureChannels) {
LAB_00119c8a:
      pcVar7 = (channel_list_entry *)malloc(0xe8);
      if (pcVar7 != (channel_list_entry *)0x0) {
        memset(pcVar7,0,0xd8);
        UVar1 = cm->lastChannelId;
        cm->lastChannelId = UVar1 + 1;
        (pcVar7->channel).securityToken.channelId = UVar1;
        UVar1 = cm->lastTokenId;
        cm->lastTokenId = UVar1 + 1;
        (pcVar7->channel).securityToken.tokenId = UVar1;
        UVar8 = UA_DateTime_now();
        (pcVar7->channel).securityToken.createdAt = UVar8;
        uVar2 = (cm->server->config).maxSecurityTokenLifetime;
        uVar5 = request->requestedLifetime;
        if (uVar2 <= request->requestedLifetime) {
          uVar5 = uVar2;
        }
        if (uVar5 == 0) {
          uVar5 = uVar2;
        }
        (pcVar7->channel).securityToken.revisedLifetime = uVar5;
        UA_ByteString_copy(&request->clientNonce,&(pcVar7->channel).clientNonce);
        UVar10 = UA_String_fromChars("http://opcfoundation.org/UA/SecurityPolicy#None");
        (pcVar7->channel).serverAsymAlgSettings.securityPolicyUri.length = UVar10.length;
        (pcVar7->channel).serverAsymAlgSettings.securityPolicyUri.data = UVar10.data;
        nonce = &(pcVar7->channel).serverNonce;
        UA_SecureChannel_generateNonce(nonce);
        UA_ByteString_copy(nonce,&response->serverNonce);
        UVar1 = (pcVar7->channel).securityToken.tokenId;
        UVar8 = (pcVar7->channel).securityToken.createdAt;
        (response->securityToken).channelId = (pcVar7->channel).securityToken.channelId;
        (response->securityToken).tokenId = UVar1;
        (response->securityToken).createdAt = UVar8;
        uVar4 = *(undefined4 *)&(pcVar7->channel).securityToken.field_0x14;
        (response->securityToken).revisedLifetime = (pcVar7->channel).securityToken.revisedLifetime;
        *(undefined4 *)&(response->securityToken).field_0x14 = uVar4;
        UVar8 = UA_DateTime_now();
        (response->responseHeader).timestamp = UVar8;
        UVar8 = UA_DateTime_nowMonotonic();
        (pcVar7->channel).securityToken.createdAt = UVar8;
        if ((pcVar7->channel).connection == (UA_Connection *)0x0) {
          (pcVar7->channel).connection = conn;
          conn->channel = (UA_SecureChannel *)pcVar7;
        }
        pcVar3 = (cm->channels).lh_first;
        (pcVar7->pointers).le_next = pcVar3;
        if (pcVar3 != (channel_list_entry *)0x0) {
          (pcVar3->pointers).le_prev = &(pcVar7->pointers).le_next;
        }
        (cm->channels).lh_first = pcVar7;
        (pcVar7->pointers).le_prev = (channel_list_entry **)cm;
        cm->currentChannelCount = cm->currentChannelCount + 1;
        return 0;
      }
    }
    else {
      while (pcVar7 = (pUVar9->channels).lh_first, pcVar7 != (channel_list_entry *)0x0) {
        if ((pcVar7->channel).sessions.lh_first == (SessionEntry *)0x0) {
          removeSecureChannel(cm,pcVar7);
          if (pcVar7 == (cm->channels).lh_first) {
            __assert_fail("entry != ((&cm->channels)->lh_first)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x48bd,
                          "UA_Boolean purgeFirstChannelWithoutSession(UA_SecureChannelManager *)");
          }
          goto LAB_00119c8a;
        }
        pUVar9 = (UA_SecureChannelManager *)&pcVar7->pointers;
      }
    }
    UVar6 = 0x80030000;
  }
  return UVar6;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_open(UA_SecureChannelManager *cm, UA_Connection *conn,
                             const UA_OpenSecureChannelRequest *request,
                             UA_OpenSecureChannelResponse *response) {
    if(request->securityMode != UA_MESSAGESECURITYMODE_NONE)
        return UA_STATUSCODE_BADSECURITYMODEREJECTED;

    //check if there exists a free SC, otherwise try to purge one SC without a session
    //the purge has been introduced to pass CTT, it is not clear what strategy is expected here
    if(cm->currentChannelCount >= cm->server->config.maxSecureChannels && !purgeFirstChannelWithoutSession(cm)){
        return UA_STATUSCODE_BADOUTOFMEMORY;
    }

    /* Set up the channel */
    channel_list_entry *entry = UA_malloc(sizeof(channel_list_entry));
    if(!entry)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    UA_SecureChannel_init(&entry->channel);
    entry->channel.securityToken.channelId = cm->lastChannelId++;
    entry->channel.securityToken.tokenId = cm->lastTokenId++;
    entry->channel.securityToken.createdAt = UA_DateTime_now();
    entry->channel.securityToken.revisedLifetime =
        (request->requestedLifetime > cm->server->config.maxSecurityTokenLifetime) ?
        cm->server->config.maxSecurityTokenLifetime : request->requestedLifetime;
    if(entry->channel.securityToken.revisedLifetime == 0) /* lifetime 0 -> set the maximum possible */
        entry->channel.securityToken.revisedLifetime = cm->server->config.maxSecurityTokenLifetime;
    UA_ByteString_copy(&request->clientNonce, &entry->channel.clientNonce);
    entry->channel.serverAsymAlgSettings.securityPolicyUri =
        UA_STRING_ALLOC("http://opcfoundation.org/UA/SecurityPolicy#None");
    UA_SecureChannel_generateNonce(&entry->channel.serverNonce);

    /* Set the response */
    UA_ByteString_copy(&entry->channel.serverNonce, &response->serverNonce);
    UA_ChannelSecurityToken_copy(&entry->channel.securityToken, &response->securityToken);
    response->responseHeader.timestamp = UA_DateTime_now();

    /* Now overwrite the creation date with the internal monotonic clock */
    entry->channel.securityToken.createdAt = UA_DateTime_nowMonotonic();

    /* Set all the pointers internally */
    UA_Connection_attachSecureChannel(conn, &entry->channel);
    LIST_INSERT_HEAD(&cm->channels, entry, pointers);
    UA_atomic_add(&cm->currentChannelCount, 1);
    return UA_STATUSCODE_GOOD;
}